

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::elementDecl
          (AbstractDOMParser *this,DTDElementDecl *decl,bool param_2)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLCh *chars;
  undefined4 extraout_var;
  XMLSize_t XVar4;
  XMLBuffer *pXVar5;
  XMLBuffer *pXVar6;
  
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    pXVar5 = this->fInternalSubset;
    XVar4 = pXVar5->fIndex;
    XVar3 = pXVar5->fCapacity;
    pXVar6 = pXVar5;
    if (XVar4 == XVar3) {
      XMLBuffer::ensureCapacity(pXVar5,1);
      XVar4 = pXVar5->fIndex;
      pXVar6 = this->fInternalSubset;
      XVar3 = pXVar6->fCapacity;
    }
    pXVar5->fIndex = XVar4 + 1;
    pXVar5->fBuffer[XVar4] = L'<';
    XVar4 = pXVar6->fIndex;
    pXVar5 = pXVar6;
    if (XVar4 == XVar3) {
      XMLBuffer::ensureCapacity(pXVar6,1);
      XVar4 = pXVar6->fIndex;
      pXVar5 = this->fInternalSubset;
    }
    pXVar6->fIndex = XVar4 + 1;
    pXVar6->fBuffer[XVar4] = L'!';
    XMLBuffer::append(pXVar5,(XMLCh *)XMLUni::fgElemString);
    pXVar5 = this->fInternalSubset;
    XVar4 = pXVar5->fIndex;
    pXVar6 = pXVar5;
    if (XVar4 == pXVar5->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar5,1);
      XVar4 = pXVar5->fIndex;
      pXVar6 = this->fInternalSubset;
    }
    pXVar5->fIndex = XVar4 + 1;
    pXVar5->fBuffer[XVar4] = L' ';
    chars = QName::getRawName((decl->super_XMLElementDecl).fElementName);
    XMLBuffer::append(pXVar6,chars);
    iVar2 = (*(decl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])(decl);
    if ((XMLCh *)CONCAT44(extraout_var,iVar2) != (XMLCh *)0x0) {
      pXVar5 = this->fInternalSubset;
      XVar4 = pXVar5->fIndex;
      pXVar6 = pXVar5;
      if (XVar4 == pXVar5->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar5,1);
        XVar4 = pXVar5->fIndex;
        pXVar6 = this->fInternalSubset;
      }
      pXVar5->fIndex = XVar4 + 1;
      pXVar5->fBuffer[XVar4] = L' ';
      XMLBuffer::append(pXVar6,(XMLCh *)CONCAT44(extraout_var,iVar2));
    }
    pXVar5 = this->fInternalSubset;
    XVar4 = pXVar5->fIndex;
    if (XVar4 == pXVar5->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar5,1);
      XVar4 = pXVar5->fIndex;
    }
    pXVar5->fIndex = XVar4 + 1;
    pXVar5->fBuffer[XVar4] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::elementDecl
(
    const   DTDElementDecl& decl
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgElemString);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(decl.getFullName());

        //get the ContentSpec information
        const XMLCh* contentModel = decl.getFormattedContentModel();
        if (contentModel != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(contentModel);
        }

        fInternalSubset.append(chCloseAngle);
    }
}